

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O2

shared_ptr<spdlog::async_logger>
spdlog::async_factory_impl<(spdlog::async_overflow_policy)0>::
create<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>,spdlog::color_mode&>
          (string *logger_name,color_mode *args)

{
  registry *this;
  pthread_mutex_t *__mutex;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::async_logger> sVar1;
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>_> sink;
  shared_ptr<spdlog::details::thread_pool> tp;
  __shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_60 [16];
  __shared_ptr<spdlog::logger,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this = details::registry::instance();
  __mutex = (pthread_mutex_t *)details::registry::tp_mutex(this);
  std::recursive_mutex::lock((recursive_mutex *)&__mutex->__data);
  details::registry::get_tp((registry *)local_60);
  if (local_60._0_8_ == 0) {
    std::make_shared<spdlog::details::thread_pool,unsigned_long_const&,unsigned_int>
              ((unsigned_long *)&local_70,(uint *)&details::default_async_q_size);
    std::__shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2> *)local_60,
               &local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::__shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    details::registry::set_tp(this,(shared_ptr<spdlog::details::thread_pool> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  std::
  make_shared<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>,spdlog::color_mode&>
            ((color_mode *)&local_70);
  std::
  make_shared<spdlog::async_logger,std::__cxx11::string,std::shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>>,std::shared_ptr<spdlog::details::thread_pool>,spdlog::async_overflow_policy>
            (logger_name,
             (shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>_>
              *)args,(shared_ptr<spdlog::details::thread_pool> *)&local_70,
             (async_overflow_policy *)local_60);
  std::__shared_ptr<spdlog::logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<spdlog::async_logger,void>
            (local_50,(__shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2> *)logger_name)
  ;
  details::registry::initialize_logger(this,(shared_ptr<spdlog::logger> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  pthread_mutex_unlock(__mutex);
  sVar1.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)logger_name;
  return (shared_ptr<spdlog::async_logger>)
         sVar1.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<async_logger> create(std::string logger_name, SinkArgs &&...args) {
        auto &registry_inst = details::registry::instance();

        // create global thread pool if not already exists..

        auto &mutex = registry_inst.tp_mutex();
        std::lock_guard<std::recursive_mutex> tp_lock(mutex);
        auto tp = registry_inst.get_tp();
        if (tp == nullptr) {
            tp = std::make_shared<details::thread_pool>(details::default_async_q_size, 1U);
            registry_inst.set_tp(tp);
        }

        auto sink = std::make_shared<Sink>(std::forward<SinkArgs>(args)...);
        auto new_logger = std::make_shared<async_logger>(std::move(logger_name), std::move(sink),
                                                         std::move(tp), OverflowPolicy);
        registry_inst.initialize_logger(new_logger);
        return new_logger;
    }